

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionMessageTest.cpp
# Opt level: O0

void __thiscall
AssertionMessageTest_stdManipulatorTest_Test::TestBody
          (AssertionMessageTest_stdManipulatorTest_Test *this)

{
  bool bVar1;
  AssertionMessage *pAVar2;
  char *message_00;
  AssertHelper local_98;
  Message local_90;
  string local_88;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  AssertionMessage message;
  allocator local_39;
  undefined1 local_38 [8];
  string expectedMessage;
  uint32_t n;
  AssertionMessageTest_stdManipulatorTest_Test *this_local;
  
  expectedMessage.field_2._12_4_ = 0x14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"0x14\n",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&gtest_ar.message_);
  pAVar2 = cppassert::internal::AssertionMessage::operator<<
                     ((AssertionMessage *)&gtest_ar.message_,std::hex);
  pAVar2 = cppassert::internal::AssertionMessage::operator<<(pAVar2,std::showbase);
  pAVar2 = cppassert::internal::AssertionMessage::operator<<
                     (pAVar2,(uint *)(expectedMessage.field_2._M_local_buf + 0xc));
  cppassert::internal::AssertionMessage::operator<<(pAVar2,std::endl<char,std::char_traits<char>>);
  cppassert::internal::AssertionMessage::str_abi_cxx11_
            (&local_88,(AssertionMessage *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_68,"expectedMessage","message.str()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,&local_88
            );
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionMessageTest.cpp"
               ,100,message_00);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  cppassert::internal::AssertionMessage::~AssertionMessage((AssertionMessage *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST(AssertionMessageTest, stdManipulatorTest)
{
    std::uint32_t n = 20;
    const std::string expectedMessage("0x14\n");
    cppassert::internal::AssertionMessage message;
    message<<std::hex<<std::showbase<<n<<std::endl;
    EXPECT_EQ(expectedMessage, message.str());
}